

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

Value fmt::internal::ArgArray<1ul,true>::
      make<fmt::BasicFormatter<char,fmt::ArgFormatter<char>>,char[8]>(char (*value) [8])

{
  anon_union_16_12_986ea841_for_Value_0 aVar1;
  anon_union_16_12_986ea841_for_Value_0 local_48 [2];
  char (*local_20) [8];
  char (*value_local) [8];
  Value result;
  
  local_20 = value;
  MakeValue<fmt::BasicFormatter<char,_fmt::ArgFormatter<char>_>_>::MakeValue
            ((MakeValue<fmt::BasicFormatter<char,_fmt::ArgFormatter<char>_>_> *)&local_48[0].string,
             *value);
  aVar1.string.size = local_48[0].string.size;
  aVar1.long_long_value = local_48[0].long_long_value;
  return (anon_union_16_12_986ea841_for_Value_0)(anon_union_16_12_986ea841_for_Value_0)aVar1.string;
}

Assistant:

static Value make(const T &value) {
#ifdef __clang__
    Value result = MakeValue<Formatter>(value);
    // Workaround a bug in Apple LLVM version 4.2 (clang-425.0.28) of clang:
    // https://github.com/fmtlib/fmt/issues/276
    (void)result.custom.format;
    return result;
#else
    return MakeValue<Formatter>(value);
#endif
  }